

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

void __thiscall
QToolBarAreaLayoutInfo::moveToolBar(QToolBarAreaLayoutInfo *this,QToolBar *toolbar,int pos)

{
  QToolBarAreaLayoutItem *pQVar1;
  QToolBarAreaLayoutItem *pQVar2;
  Orientation OVar3;
  QToolBarAreaLayoutItem *pQVar4;
  QLayoutItem *pQVar5;
  Representation RVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  pointer pQVar10;
  QList<QToolBarAreaLayoutItem> *this_00;
  pointer pQVar11;
  undefined4 extraout_var;
  QSize QVar12;
  QSize QVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  int local_74;
  ulong local_68;
  
  if (this->dirty == true) {
    fitLayout(this);
  }
  this->dirty = true;
  iVar14 = 0;
  if (this->o == Vertical) {
    iVar14 = (this->rect).y1.m_i;
  }
  if ((this->lines).d.size != 0) {
    iVar14 = pos - iVar14;
    local_68 = 0;
    do {
      pQVar10 = QList<QToolBarAreaLayoutLine>::data(&this->lines);
      if (pQVar10[local_68].toolBarItems.d.size != 0) {
        this_00 = &pQVar10[local_68].toolBarItems;
        lVar18 = 0;
        uVar20 = 0xffffffff;
        uVar15 = 0;
        local_74 = 0;
        do {
          pQVar11 = QList<QToolBarAreaLayoutItem>::data(this_00);
          pQVar1 = pQVar11 + uVar15;
          iVar7 = (*pQVar1->widgetItem->_vptr_QLayoutItem[0xd])();
          if ((QToolBar *)CONCAT44(extraout_var,iVar7) == toolbar) {
            if (-1 < (int)uVar20) {
              pQVar11 = QList<QToolBarAreaLayoutItem>::data(this_00);
              if (iVar14 < pQVar1->pos) {
                iVar8 = local_74;
                if (local_74 < iVar14) {
                  iVar8 = iVar14;
                }
              }
              else {
                iVar8 = (this->rect).y2.m_i - (this->rect).y1.m_i;
                if (this->o == Horizontal) {
                  iVar8 = (this->rect).x2.m_i - (this->rect).x1.m_i;
                }
                iVar8 = iVar8 + 1;
                lVar17 = lVar18;
                uVar21 = uVar15;
                if (uVar15 < (ulong)pQVar10[local_68].toolBarItems.d.size) {
                  do {
                    pQVar4 = pQVar10[local_68].toolBarItems.d.ptr;
                    pQVar2 = (QToolBarAreaLayoutItem *)((long)&pQVar4->widgetItem + lVar17);
                    if (((&pQVar4->gap)[lVar17] != false) ||
                       ((pQVar5 = pQVar2->widgetItem, pQVar5 != (QLayoutItem *)0x0 &&
                        (iVar16 = (*pQVar5->_vptr_QLayoutItem[8])(), (char)iVar16 == '\0')))) {
                      OVar3 = this->o;
                      QVar13 = QToolBarAreaLayoutItem::minimumSize(pQVar2);
                      RVar6 = QVar13.ht.m_i;
                      if (OVar3 == Horizontal) {
                        RVar6 = QVar13.wd.m_i;
                      }
                      iVar8 = iVar8 - RVar6.m_i;
                    }
                    uVar21 = uVar21 + 1;
                    lVar17 = lVar17 + 0x18;
                  } while (uVar21 < (ulong)pQVar10[local_68].toolBarItems.d.size);
                }
                if (iVar14 < iVar8) {
                  iVar8 = iVar14;
                }
              }
              pQVar2 = pQVar11 + (uVar20 & 0xffffffff);
              iVar8 = iVar8 - pQVar1->pos;
              OVar3 = this->o;
              QVar12 = QToolBarAreaLayoutItem::sizeHint(pQVar2);
              QVar13 = (QSize)((ulong)QVar12 >> 0x20);
              if (OVar3 == Horizontal) {
                QVar13 = QVar12;
              }
              iVar19 = QVar13.wd.m_i.m_i - (pQVar2->size + iVar8);
              iVar16 = -iVar19;
              if (0 < iVar19) {
                iVar16 = iVar19;
              }
              iVar9 = QApplication::startDragDistance();
              if (iVar9 <= iVar16) {
                iVar19 = 0;
              }
              iVar19 = iVar19 + iVar8;
              iVar8 = -iVar19;
              QToolBarAreaLayoutItem::extendSize(pQVar1,pQVar10[local_68].o,iVar8);
              if (iVar19 < 0) {
                iVar16 = (int)uVar20 + 1;
                lVar17 = (uVar20 & 0xffffffff) * 0x18;
                do {
                  pQVar11 = QList<QToolBarAreaLayoutItem>::data(this_00);
                  pQVar1 = (QToolBarAreaLayoutItem *)((long)&pQVar11->widgetItem + lVar17);
                  if (((&pQVar11->gap)[lVar17] != false) ||
                     ((pQVar1->widgetItem != (QLayoutItem *)0x0 &&
                      (iVar19 = (*pQVar1->widgetItem->_vptr_QLayoutItem[8])(), (char)iVar19 == '\0')
                      ))) {
                    OVar3 = this->o;
                    QVar12 = QToolBarAreaLayoutItem::minimumSize(pQVar1);
                    QVar13 = (QSize)((ulong)QVar12 >> 0x20);
                    if (OVar3 == Horizontal) {
                      QVar13 = QVar12;
                    }
                    iVar19 = *(int *)((long)&pQVar11->size + lVar17) - QVar13.wd.m_i;
                    iVar9 = iVar8 - iVar19;
                    if (iVar9 == 0 || iVar8 < iVar19) {
                      QToolBarAreaLayoutItem::extendSize(pQVar1,pQVar10[local_68].o,-iVar8);
                      iVar8 = 0;
                    }
                    else {
                      QToolBarAreaLayoutItem::resize(pQVar1,pQVar10[local_68].o,QVar13.wd.m_i.m_i);
                      iVar8 = iVar9;
                    }
                  }
                  iVar16 = iVar16 + -1;
                  lVar17 = lVar17 + -0x18;
                } while (0 < iVar16);
              }
              else {
                QToolBarAreaLayoutItem::extendSize(pQVar2,pQVar10[local_68].o,iVar19);
              }
            }
          }
          else if ((pQVar1->gap != false) ||
                  ((pQVar1->widgetItem != (QLayoutItem *)0x0 &&
                   (iVar8 = (*pQVar1->widgetItem->_vptr_QLayoutItem[8])(), (char)iVar8 == '\0')))) {
            OVar3 = this->o;
            QVar12 = QToolBarAreaLayoutItem::minimumSize(pQVar1);
            QVar13 = (QSize)((ulong)QVar12 >> 0x20);
            if (OVar3 == Horizontal) {
              QVar13 = QVar12;
            }
            local_74 = local_74 + QVar13.wd.m_i.m_i;
            uVar20 = uVar15;
          }
          if ((QToolBar *)CONCAT44(extraout_var,iVar7) == toolbar) {
            return;
          }
          uVar15 = uVar15 + 1;
          lVar18 = lVar18 + 0x18;
        } while (uVar15 < (ulong)pQVar10[local_68].toolBarItems.d.size);
      }
      local_68 = local_68 + 1;
    } while (local_68 < (ulong)(this->lines).d.size);
  }
  return;
}

Assistant:

void QToolBarAreaLayoutInfo::moveToolBar(QToolBar *toolbar, int pos)
{
    if (dirty)
        fitLayout();

    dirty = true;

    if (o == Qt::Vertical)
        pos -= rect.top();

    //here we actually update the preferredSize for the line containing the toolbar so that we move it
    for (int j = 0; j < lines.size(); ++j) {
        QToolBarAreaLayoutLine &line = lines[j];

        int previousIndex = -1;
        int minPos = 0;
        for (int k = 0; k < line.toolBarItems.size(); ++k) {
            QToolBarAreaLayoutItem &current = line.toolBarItems[k];
            if (current.widgetItem->widget() == toolbar) {
                int newPos = current.pos;

                if (previousIndex >= 0) {
                    QToolBarAreaLayoutItem &previous = line.toolBarItems[previousIndex];
                    if (pos < current.pos) {
                        newPos = qMax(pos, minPos);
                    } else {
                        //we check the max value for the position (until everything at the right is "compressed")
                        int maxPos = pick(o, rect.size());
                        for(int l = k; l < line.toolBarItems.size(); ++l) {
                            const QToolBarAreaLayoutItem &item = line.toolBarItems.at(l);
                            if (!item.skip()) {
                                maxPos -= pick(o, item.minimumSize());
                            }
                        }
                        newPos = qMin(pos, maxPos);
                    }

                    //extra is the number of pixels to add to the previous toolbar
                    int extra = newPos - current.pos;

                    //we check if the previous is near its size hint
                    //in which case we try to stick to it
                    const int diff = pick(o, previous.sizeHint()) - (previous.size + extra);
                    if (qAbs(diff) < QApplication::startDragDistance()) {
                        //we stick to the default place and size
                        extra += diff;
                    }

                    //update for the current item
                    current.extendSize(line.o, -extra);

                    if (extra >= 0) {
                        previous.extendSize(line.o, extra);
                    } else {
                        //we need to push the toolbars on the left starting with previous
                        extra = -extra; // we just need to know the number of pixels
                        ///at this point we need to get extra pixels from the toolbars at the left
                        for(int l = previousIndex; l >=0; --l) {
                            QToolBarAreaLayoutItem &item = line.toolBarItems[l];
                            if (!item.skip()) {
                                const int minPreferredSize = pick(o, item.minimumSize());
                                const int margin =  item.size - minPreferredSize;
                                if (margin < extra) {
                                    item.resize(line.o, minPreferredSize);
                                    extra -= margin;
                                } else {
                                    item.extendSize(line.o, -extra);
                                    extra = 0;
                                }
                            }
                        }
                        Q_ASSERT(extra == 0);
                    }
                } else {
                    //the item is the first one, it should be at position 0
                }

                return;

            } else if (!current.skip()) {
                previousIndex = k;
                minPos += pick(o, current.minimumSize());
            }
        }
    }
}